

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char cVar2;
  byte *z;
  int iVar3;
  Unicode61Tokenizer *p;
  char *pcVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  char *zCat;
  u16 *puVar8;
  uint uVar9;
  
  iVar3 = 1;
  if ((nArg & 1U) == 0) {
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0);
    }
    else {
      p = (Unicode61Tokenizer *)0x0;
    }
    if (p == (Unicode61Tokenizer *)0x0) {
      iVar3 = 7;
    }
    else {
      memset(p,0,0xc0);
      p->nFold = 0x40;
      p->eRemoveDiacritic = 1;
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        pcVar4 = (char *)sqlite3Malloc(0x40);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      p->aFold = pcVar4;
      iVar3 = 7;
      if (pcVar4 != (char *)0x0) {
        iVar3 = 0;
      }
      zCat = "L* N* Co";
      if (0 < nArg && pcVar4 != (char *)0x0) {
        lVar5 = 0;
LAB_001d772f:
        if (azArg[lVar5] != (char *)0x0) {
          lVar6 = 0;
          do {
            bVar1 = azArg[lVar5][lVar6];
            if (bVar1 == "categories"[lVar6]) {
              if ((ulong)bVar1 == 0) goto LAB_001d775f;
            }
            else if (""[bVar1] != ""[(byte)"categories"[lVar6]]) break;
            lVar6 = lVar6 + 1;
          } while( true );
        }
        goto LAB_001d7764;
      }
LAB_001d7772:
      if (pcVar4 != (char *)0x0) {
        if (*zCat != '\0') {
          do {
            while (cVar2 = *zCat, cVar2 == '\0') {
LAB_001d77c3:
              while( true ) {
                cVar2 = *zCat;
                if (cVar2 == '\0') goto LAB_001d77db;
                if ((cVar2 == '\t') || (cVar2 == ' ')) break;
                zCat = zCat + 1;
              }
            }
            if ((cVar2 != ' ') && (cVar2 != '\t')) {
              iVar3 = sqlite3Fts5UnicodeCatParse(zCat,p->aCategory);
              if (iVar3 == 0) goto LAB_001d77c3;
              iVar3 = 1;
              goto LAB_001d7849;
            }
            zCat = zCat + 1;
          } while( true );
        }
LAB_001d77db:
        uVar7 = 0;
        puVar8 = aFts5UnicodeData;
        do {
          uVar9 = (*puVar8 >> 5) + uVar7;
          if (0x7f < (int)uVar9) {
            uVar9 = 0x80;
          }
          if ((int)uVar7 < (int)uVar9) {
            memset(p->aTokenChar + (int)uVar7,(uint)p->aCategory[*puVar8 & 0x1f],
                   (ulong)(~uVar7 + uVar9) + 1);
            uVar7 = uVar9;
          }
          puVar8 = puVar8 + 1;
        } while ((int)uVar7 < 0x80);
        iVar3 = 0;
      }
LAB_001d7849:
      if (0 < nArg && iVar3 == 0) {
        lVar5 = 0;
LAB_001d7875:
        pcVar4 = azArg[lVar5];
        iVar3 = 1;
        if (pcVar4 != (char *)0x0) {
          z = (byte *)azArg[lVar5 + 1];
          lVar6 = 0;
          do {
            bVar1 = pcVar4[lVar6];
            if (bVar1 == "remove_diacritics"[lVar6]) {
              if ((ulong)bVar1 == 0) goto LAB_001d78b1;
            }
            else if (""[bVar1] != ""[(byte)"remove_diacritics"[lVar6]]) {
              iVar3 = 1;
              if (pcVar4 == (char *)0x0) break;
              lVar6 = 0;
              goto LAB_001d78f3;
            }
            lVar6 = lVar6 + 1;
          } while( true );
        }
        goto LAB_001d7970;
      }
    }
LAB_001d79bd:
    if (iVar3 != 0) {
      fts5UnicodeDelete((Fts5Tokenizer *)p);
      p = (Unicode61Tokenizer *)0x0;
    }
    *ppOut = (Fts5Tokenizer *)p;
  }
  return iVar3;
LAB_001d775f:
  zCat = azArg[lVar5 + 1];
LAB_001d7764:
  if ((pcVar4 == (char *)0x0) || (lVar5 = lVar5 + 2, nArg <= (int)lVar5)) goto LAB_001d7772;
  goto LAB_001d772f;
LAB_001d78f3:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "tokenchars"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001d7915;
  }
  else if (""[bVar1] != ""[(byte)"tokenchars"[lVar6]]) {
    iVar3 = 1;
    if (pcVar4 == (char *)0x0) goto LAB_001d7970;
    lVar6 = 0;
    goto LAB_001d7935;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001d78f3;
LAB_001d7935:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "separators"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001d7957;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar6]]) {
    iVar3 = 1;
    if (pcVar4 == (char *)0x0) goto LAB_001d7970;
    lVar6 = 0;
    goto LAB_001d7991;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001d7935;
LAB_001d7991:
  bVar1 = pcVar4[lVar6];
  if (bVar1 == "categories"[lVar6]) {
    if ((ulong)bVar1 == 0) goto LAB_001d78de;
  }
  else if (""[bVar1] != ""[(byte)"categories"[lVar6]]) {
    iVar3 = 1;
    goto LAB_001d7970;
  }
  lVar6 = lVar6 + 1;
  goto LAB_001d7991;
LAB_001d7957:
  iVar3 = 0;
  goto LAB_001d795e;
LAB_001d7915:
  iVar3 = 1;
LAB_001d795e:
  iVar3 = fts5UnicodeAddExceptions(p,(char *)z,iVar3);
LAB_001d7970:
  if ((iVar3 != 0) || (lVar5 = lVar5 + 2, nArg <= (int)lVar5)) goto LAB_001d79bd;
  goto LAB_001d7875;
LAB_001d78b1:
  iVar3 = 1;
  if (((byte)(*z - 0x30) < 3) && (z[1] == 0)) {
    p->eRemoveDiacritic = *z - 0x30;
LAB_001d78de:
    iVar3 = 0;
  }
  goto LAB_001d7970;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}